

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void __thiscall inject::context<0>::context(context<0> *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_context = (_func_int **)&PTR__context_00111818;
  p_Var1 = &(this->_bindings)._M_t._M_impl.super__Rb_tree_header;
  (this->_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_bindings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_singletons)._M_t._M_impl.super__Rb_tree_header;
  (this->_singletons)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_singletons)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_singletons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_singletons)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_singletons)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_parent = head()::_head;
  head()::_head = this;
  current()::_current = this;
  return;
}

Assistant:

context() { init(); }